

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_to_lower_bound.hpp
# Opt level: O1

void burst::
     skip_to_lower_bound<boost::iterator_range<std::_List_const_iterator<char>>,char,std::greater<void>>
               (long *range,char *goal)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  long *plVar6;
  
  plVar4 = (long *)*range;
  plVar2 = (long *)range[1];
  plVar5 = plVar2;
  plVar6 = plVar4;
  if (plVar4 != plVar2) {
    do {
      plVar3 = (long *)*plVar6;
      plVar5 = plVar2;
      if (plVar3 == plVar2) break;
      plVar1 = plVar6 + 2;
      plVar5 = plVar3;
      plVar6 = plVar3;
    } while ((char)plVar3[2] <= (char)*plVar1);
  }
  if (plVar5 != plVar2) {
    __assert_fail("boost::algorithm::is_sorted(range, compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/range/skip_to_lower_bound.hpp"
                  ,0x18,
                  "void burst::skip_to_lower_bound(Range &, const Value &, Compare) [Range = boost::iterator_range<std::_List_const_iterator<char>>, Value = char, Compare = std::greater<void>]"
                 );
  }
  while ((plVar4 != plVar2 && (*goal < (char)plVar4[2]))) {
    plVar4 = (long *)*plVar4;
    *range = (long)plVar4;
  }
  return;
}

Assistant:

void skip_to_lower_bound (Range & range, const Value & goal, Compare compare)
    {
        BOOST_ASSERT(boost::algorithm::is_sorted(range, compare));
        detail::skip_to_lower_bound(range, goal, compare);
    }